

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O2

OPENSSL_STACK * OPENSSL_sk_new(OPENSSL_sk_cmp_func comp)

{
  OPENSSL_STACK *orig_ptr;
  void **ppvVar1;
  
  orig_ptr = (OPENSSL_STACK *)OPENSSL_zalloc(0x28);
  if (orig_ptr != (OPENSSL_STACK *)0x0) {
    ppvVar1 = (void **)OPENSSL_calloc(4,8);
    orig_ptr->data = ppvVar1;
    if (ppvVar1 != (void **)0x0) {
      orig_ptr->comp = comp;
      orig_ptr->num_alloc = 4;
      return orig_ptr;
    }
    OPENSSL_free(orig_ptr);
  }
  return (OPENSSL_STACK *)0x0;
}

Assistant:

OPENSSL_STACK *OPENSSL_sk_new(OPENSSL_sk_cmp_func comp) {
  OPENSSL_STACK *ret =
      reinterpret_cast<OPENSSL_STACK *>(OPENSSL_zalloc(sizeof(OPENSSL_STACK)));
  if (ret == NULL) {
    return NULL;
  }

  ret->data =
      reinterpret_cast<void **>(OPENSSL_calloc(kMinSize, sizeof(void *)));
  if (ret->data == NULL) {
    goto err;
  }

  ret->comp = comp;
  ret->num_alloc = kMinSize;

  return ret;

err:
  OPENSSL_free(ret);
  return NULL;
}